

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)

{
  uint x_00;
  uint y_00;
  int iVar1;
  stbi_uc *psVar2;
  int y;
  int x;
  int i;
  stbi_uc *result;
  int req_comp_local;
  int *comp_local;
  int *py_local;
  int *px_local;
  stbi__context *s_local;
  
  for (y = 0; y < 0x5c; y = y + 1) {
    stbi__get8(s);
  }
  x_00 = stbi__get16be(s);
  y_00 = stbi__get16be(s);
  iVar1 = stbi__at_eof(s);
  if (iVar1 == 0) {
    if ((int)(0x10000000 / (long)(int)x_00) < (int)y_00) {
      stbi__err("too large");
      s_local = (stbi__context *)0x0;
    }
    else {
      stbi__get32be(s);
      stbi__get16be(s);
      stbi__get16be(s);
      _x = (stbi_uc *)stbi__malloc((long)(int)(x_00 * y_00 * 4));
      memset(_x,0xff,(long)(int)(x_00 * y_00 * 4));
      psVar2 = stbi__pic_load_core(s,x_00,y_00,comp,_x);
      if (psVar2 == (stbi_uc *)0x0) {
        free(_x);
        _x = (uchar *)0x0;
      }
      *px = x_00;
      *py = y_00;
      result._4_4_ = req_comp;
      if (req_comp == 0) {
        result._4_4_ = *comp;
      }
      s_local = (stbi__context *)stbi__convert_format(_x,4,result._4_4_,x_00,y_00);
    }
  }
  else {
    stbi__err("bad file");
    s_local = (stbi__context *)0x0;
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)
{
   stbi_uc *result;
   int i, x,y;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if ((1 << 28) / x < y) return stbi__errpuc("too large", "Image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc(x*y*4);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}